

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.hpp
# Opt level: O2

uint __thiscall diy::io::NumPy::read_header(NumPy *this)

{
  uint uVar1;
  size_t sVar2;
  runtime_error *this_00;
  bool fortran;
  Shape shape;
  
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar2 = parse_npy_header(this,&shape,&fortran);
  if (fortran != true) {
    (this->super_BOV).offset_ = sVar2;
    BOV::set_shape<std::vector<int,std::allocator<int>>>(&this->super_BOV,&shape);
    uVar1 = this->word_size_;
    Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&shape.super__Vector_base<int,_std::allocator<int>_>);
    return uVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"diy::io::NumPy cannot read data in fortran order");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unsigned          read_header()
      {
        BOV::Shape  shape;
        bool        fortran;
        size_t      offset = parse_npy_header(shape, fortran);
        if (fortran)
            throw std::runtime_error("diy::io::NumPy cannot read data in fortran order");
        BOV::set_offset(offset);
        BOV::set_shape(shape);
        return word_size_;
      }